

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O0

RK_S32 mastering_display_colour_volume(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  undefined2 local_64 [2];
  undefined2 local_60 [2];
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 _out;
  RK_U32 lum;
  RK_U16 value;
  BitReadCtx_t *pBStack_48;
  RK_S32 i;
  BitReadCtx_t *gb_local;
  HEVCContext *s_local;
  
  _out._2_2_ = 0;
  _out_1 = 0;
  lum = 0;
  pBStack_48 = gb;
  gb_local = (BitReadCtx_t *)s;
  while( true ) {
    if (2 < (int)lum) {
      MVar1 = mpp_read_bits(pBStack_48,0x10,(RK_S32 *)local_60);
      pBStack_48->ret = MVar1;
      if (pBStack_48->ret == MPP_OK) {
        _out._2_2_ = local_60[0];
        *(undefined2 *)&gb_local[0x6ce].prev_two_bytes_ = local_60[0];
        MVar1 = mpp_read_bits(pBStack_48,0x10,(RK_S32 *)local_64);
        pBStack_48->ret = MVar1;
        if (pBStack_48->ret == MPP_OK) {
          _out._2_2_ = local_64[0];
          *(undefined2 *)((long)&gb_local[0x6ce].prev_two_bytes_ + 2) = local_64[0];
          mpp_read_longbits(pBStack_48,0x20,(RK_U32 *)&_out_1);
          *(RK_S32 *)((long)&gb_local[0x6ce].prev_two_bytes_ + 4) = _out_1;
          mpp_read_longbits(pBStack_48,0x20,(RK_U32 *)&_out_1);
          *(RK_S32 *)&gb_local[0x6ce].emulation_prevention_bytes_ = _out_1;
          if ((h265d_debug & 0x20) != 0) {
            _mpp_log_l(4,"h265d_sei",
                       "dis_prim [%d %d] [%d %d] [%d %d] white point %d %d luminance %d %d\n",
                       (char *)0x0,(ulong)*(ushort *)((long)&gb_local[0x6ce].curr_byte_ + 4),
                       (ulong)*(ushort *)((long)&gb_local[0x6ce].curr_byte_ + 6),
                       (uint)(ushort)gb_local[0x6ce].num_remaining_bits_in_curr_byte_,
                       (uint)*(ushort *)
                              ((long)&gb_local[0x6ce].num_remaining_bits_in_curr_byte_ + 2),
                       (uint)*(ushort *)&gb_local[0x6ce].field_0x1c,
                       (uint)*(ushort *)&gb_local[0x6ce].field_0x1e,
                       (uint)(ushort)gb_local[0x6ce].prev_two_bytes_,
                       (uint)*(ushort *)((long)&gb_local[0x6ce].prev_two_bytes_ + 2),
                       *(undefined4 *)((long)&gb_local[0x6ce].prev_two_bytes_ + 4),
                       (int)gb_local[0x6ce].emulation_prevention_bytes_);
          }
          return 0;
        }
      }
      return -0x3ec;
    }
    MVar1 = mpp_read_bits(pBStack_48,0x10,&_out_2);
    pBStack_48->ret = MVar1;
    if (pBStack_48->ret != MPP_OK) break;
    _out._2_2_ = (undefined2)_out_2;
    *(undefined2 *)((long)&gb_local[0x6ce].curr_byte_ + (long)(int)lum * 4 + 4) = _out._2_2_;
    MVar1 = mpp_read_bits(pBStack_48,0x10,&_out_3);
    pBStack_48->ret = MVar1;
    if (pBStack_48->ret != MPP_OK) {
      return -0x3ec;
    }
    _out._2_2_ = (undefined2)_out_3;
    *(undefined2 *)((long)&gb_local[0x6ce].curr_byte_ + (long)(int)lum * 4 + 6) = _out._2_2_;
    lum = lum + 1;
  }
  return -0x3ec;
}

Assistant:

static RK_S32 mastering_display_colour_volume(HEVCContext *s, BitReadCtx_t *gb)
{
    RK_S32 i = 0;
    RK_U16 value = 0;
    RK_U32 lum = 0;

    for (i = 0; i < 3; i++) {
        READ_BITS(gb, 16, &value);
        s->mastering_display.display_primaries[i][0] = value;
        READ_BITS(gb, 16, &value);
        s->mastering_display.display_primaries[i][1] = value;
    }
    READ_BITS(gb, 16, &value);
    s->mastering_display.white_point[0] = value;
    READ_BITS(gb, 16, &value);
    s->mastering_display.white_point[1] = value;
    mpp_read_longbits(gb, 32, &lum);
    s->mastering_display.max_luminance = lum;
    mpp_read_longbits(gb, 32, &lum);
    s->mastering_display.min_luminance = lum;

    h265d_dbg(H265D_DBG_SEI, "dis_prim [%d %d] [%d %d] [%d %d] white point %d %d luminance %d %d\n",
              s->mastering_display.display_primaries[0][0],
              s->mastering_display.display_primaries[0][1],
              s->mastering_display.display_primaries[1][0],
              s->mastering_display.display_primaries[1][1],
              s->mastering_display.display_primaries[2][0],
              s->mastering_display.display_primaries[2][1],
              s->mastering_display.white_point[0],
              s->mastering_display.white_point[1],
              s->mastering_display.max_luminance,
              s->mastering_display.min_luminance);

    return 0;

__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}